

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void create_colormap(j_decompress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  jpeg_error_mgr *pjVar2;
  JDIMENSION JVar3;
  JDIMENSION JVar4;
  int iVar5;
  JSAMPARRAY ppJVar6;
  j_decompress_ptr in_RDI;
  int *_mp;
  int val;
  int ptr;
  int blkdist;
  int blksize;
  int nci;
  int k;
  int j;
  int i;
  int total_colors;
  JSAMPARRAY colormap;
  my_cquantize_ptr cquantize;
  int local_38;
  JDIMENSION local_34;
  int local_28;
  int local_24;
  int local_20;
  int *in_stack_ffffffffffffffe8;
  j_decompress_ptr cinfo_00;
  
  cinfo_00 = (j_decompress_ptr)in_RDI->cquantize;
  JVar3 = select_ncolors(cinfo_00,in_stack_ffffffffffffffe8);
  if (in_RDI->out_color_components == 3) {
    pjVar2 = in_RDI->err;
    (pjVar2->msg_parm).i[0] = JVar3;
    (pjVar2->msg_parm).i[1] = cinfo_00->jpeg_color_space;
    (pjVar2->msg_parm).i[2] = cinfo_00->out_color_space;
    (pjVar2->msg_parm).i[3] = cinfo_00->scale_num;
    in_RDI->err->msg_code = 0x5e;
    (*in_RDI->err->emit_message)((j_common_ptr)in_RDI,1);
  }
  else {
    in_RDI->err->msg_code = 0x5f;
    (in_RDI->err->msg_parm).i[0] = JVar3;
    (*in_RDI->err->emit_message)((j_common_ptr)in_RDI,1);
  }
  ppJVar6 = (*in_RDI->mem->alloc_sarray)((j_common_ptr)in_RDI,1,JVar3,in_RDI->out_color_components);
  local_34 = JVar3;
  for (local_20 = 0; local_20 < in_RDI->out_color_components; local_20 = local_20 + 1) {
    JVar1 = (&cinfo_00->jpeg_color_space)[local_20];
    JVar4 = (int)local_34 / (int)JVar1;
    for (local_24 = 0; local_24 < (int)JVar1; local_24 = local_24 + 1) {
      iVar5 = output_value(in_RDI,local_20,local_24,JVar1 - JCS_GRAYSCALE);
      for (local_38 = local_24 * JVar4; local_38 < (int)JVar3; local_38 = local_34 + local_38) {
        for (local_28 = 0; local_28 < (int)JVar4; local_28 = local_28 + 1) {
          ppJVar6[local_20][local_38 + local_28] = (JSAMPLE)iVar5;
        }
      }
    }
    local_34 = JVar4;
  }
  *(JSAMPARRAY *)&cinfo_00->is_decompressor = ppJVar6;
  *(JDIMENSION *)&cinfo_00->src = JVar3;
  return;
}

Assistant:

LOCAL(void)
create_colormap(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  JSAMPARRAY colormap;          /* Created colormap */
  int total_colors;             /* Number of distinct output colors */
  int i, j, k, nci, blksize, blkdist, ptr, val;

  /* Select number of colors for each component */
  total_colors = select_ncolors(cinfo, cquantize->Ncolors);

  /* Report selected color counts */
  if (cinfo->out_color_components == 3)
    TRACEMS4(cinfo, 1, JTRC_QUANT_3_NCOLORS, total_colors,
             cquantize->Ncolors[0], cquantize->Ncolors[1],
             cquantize->Ncolors[2]);
  else
    TRACEMS1(cinfo, 1, JTRC_QUANT_NCOLORS, total_colors);

  /* Allocate and fill in the colormap. */
  /* The colors are ordered in the map in standard row-major order, */
  /* i.e. rightmost (highest-indexed) color changes most rapidly. */

  colormap = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)total_colors, (JDIMENSION)cinfo->out_color_components);

  /* blksize is number of adjacent repeated entries for a component */
  /* blkdist is distance between groups of identical entries for a component */
  blkdist = total_colors;

  for (i = 0; i < cinfo->out_color_components; i++) {
    /* fill in colormap entries for i'th color component */
    nci = cquantize->Ncolors[i]; /* # of distinct values for this color */
    blksize = blkdist / nci;
    for (j = 0; j < nci; j++) {
      /* Compute j'th output value (out of nci) for component */
      val = output_value(cinfo, i, j, nci - 1);
      /* Fill in all colormap entries that have this value of this component */
      for (ptr = j * blksize; ptr < total_colors; ptr += blkdist) {
        /* fill in blksize entries beginning at ptr */
        for (k = 0; k < blksize; k++)
          colormap[i][ptr + k] = (JSAMPLE)val;
      }
    }
    blkdist = blksize;          /* blksize of this color is blkdist of next */
  }

  /* Save the colormap in private storage,
   * where it will survive color quantization mode changes.
   */
  cquantize->sv_colormap = colormap;
  cquantize->sv_actual = total_colors;
}